

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O3

int fy_fetch_plain_scalar(fy_parser *fyp,int c)

{
  undefined4 uVar1;
  undefined4 uVar2;
  _Bool _Var3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  fy_atom *pfVar9;
  void *pvVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar12;
  fy_input *pfVar13;
  long lVar14;
  undefined7 uVar15;
  char *pcVar16;
  fy_diag_report_ctx *fydrc;
  size_t sVar17;
  int iVar18;
  ulong uVar19;
  bool bVar20;
  undefined1 local_158 [48];
  char *apcStack_128 [2];
  char acStack_118 [8];
  fy_diag_report_ctx local_110;
  undefined1 local_e8 [8];
  fy_simple_key_mark skm;
  fy_mark local_c8;
  ulong local_b0;
  long local_a8;
  void *local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  size_t local_78;
  uint local_64;
  fy_token *local_60;
  int local_54;
  size_t local_50;
  int local_44;
  ulong local_40;
  byte local_31;
  
  if ((c == 9) && (fyp->state == FYPS_BLOCK_MAPPING_VALUE)) {
    fydrc = (fy_diag_report_ctx *)local_98;
    local_88._0_8_ = 0;
    local_88._8_8_ = (char *)0x0;
    local_78 = 0;
    local_98._0_8_ = 0x200000004;
    pfVar9 = fy_fill_atom_at(fyp,0,1,(fy_atom *)local_158);
    local_98._8_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar9);
    pcVar16 = "invalid tab as indendation in a mapping";
    goto LAB_00133969;
  }
  if ((((uint)c < 0x21) && ((0x100002600U >> ((ulong)(uint)c & 0x3f) & 1) != 0)) ||
     ((((fyp->current_input == (fy_input *)0x0 || ((fyp->current_input->field_0x74 & 1) == 0)) &&
       ((c - 0x2028U < 2 || (c == 0x85)))) || (c < 1)))) {
    fydrc = (fy_diag_report_ctx *)local_98;
    local_88._0_8_ = 0;
    local_88._8_8_ = (char *)0x0;
    local_78 = 0;
    local_98._0_8_ = 0x200000004;
    pfVar9 = fy_fill_atom_at(fyp,0,1,(fy_atom *)local_158);
    local_98._8_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar9);
    pcVar16 = "plain scalar cannot start with blank or zero";
    goto LAB_00133969;
  }
  if ((uint)c < 0x80) {
    apcStack_128[1] = (char *)0x1339d3;
    pvVar10 = memchr(",[]{}#&*!|>\'\"%@`",c,0x11);
  }
  else {
    apcStack_128[1] = (char *)0x1339e2;
    pvVar10 = fy_utf8_memchr_generic(",[]{}#&*!|>\'\"%@`",c,0x10);
  }
  if (pvVar10 != (void *)0x0) {
    local_88._0_8_ = 0;
    local_88._8_8_ = (char *)0x0;
    local_78 = 0;
    local_98._0_8_ = 0x200000004;
    pfVar9 = fy_fill_atom_at(fyp,0,1,(fy_atom *)local_158);
    local_98._8_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar9);
    pcVar16 = "plain scalar cannot start with \'%c\'";
LAB_00133a3c:
    uVar12 = (ulong)(uint)c;
LAB_00133a45:
    fy_parser_diag_report(fyp,(fy_diag_report_ctx *)local_98,pcVar16,uVar12);
    return -1;
  }
  if (c == 0x2d) {
    apcStack_128[1] = (char *)0x133a64;
    iVar4 = fy_parse_peek_at_offset(fyp,1);
    if ((iVar4 == 0x20) || (iVar4 == 9)) {
      local_88._0_8_ = 0;
      local_88._8_8_ = (char *)0x0;
      local_78 = 0;
      local_98._0_8_ = 0x200000004;
      pfVar9 = fy_fill_atom_at(fyp,0,2,(fy_atom *)local_158);
      local_98._8_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar9);
      pcVar16 = "plain scalar cannot start with \'%c\' followed by blank";
      uVar12 = 0x2d;
      goto LAB_00133a45;
    }
  }
  iVar4 = fyp->flow_level;
  if (iVar4 == 0) {
    iVar18 = 0;
    bVar20 = true;
    if ((c != 0x3f) && (c != 0x3a)) goto LAB_00133c0a;
    apcStack_128[1] = (char *)0x133b17;
    iVar4 = fy_parse_peek_at_offset(fyp,1);
    if ((iVar4 == 0x20) || (iVar4 == 9)) {
      local_88._0_8_ = 0;
      local_88._8_8_ = (char *)0x0;
      local_78 = 0;
      local_98._0_8_ = 0x200000004;
      pfVar9 = fy_fill_atom_at(fyp,0,2,(fy_atom *)local_158);
      local_98._8_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar9);
      pcVar16 = "plain scalar cannot start with \'%c\' followed by blank (in block context)";
      goto LAB_00133a3c;
    }
    iVar4 = fyp->flow_level;
    if (iVar4 == 0) goto LAB_00133c0a;
  }
  if (fyp->column <= fyp->indent) {
    local_88._0_8_ = 0;
    local_88._8_8_ = (char *)0x0;
    local_78 = 0;
    local_98._0_8_ = 0x200000004;
    pfVar9 = fy_fill_atom_at(fyp,0,1,(fy_atom *)local_158);
    local_98._8_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar9);
    pcVar16 = "mapping";
    if (fyp->flow == FYFT_SEQUENCE) {
      pcVar16 = "sequence";
    }
    fy_parser_diag_report(fyp,(fy_diag_report_ctx *)local_98,"wrongly indented flow %s",pcVar16);
    return -1;
  }
  bVar20 = false;
  iVar18 = iVar4;
LAB_00133c0a:
  local_e8 = (undefined1  [8])fyp->current_input_pos;
  skm.mark.input_pos._0_4_ = fyp->line;
  skm.mark.input_pos._4_4_ = fyp->column;
  iVar4 = 0;
  skm.mark.line._0_1_ = false;
  if (bVar20) {
    skm.mark.line._0_1_ = fyp->indent == skm.mark.input_pos._4_4_;
  }
  apcStack_128[1] = (char *)0x133c59;
  skm.mark.column = iVar18;
  fy_fill_atom_start(fyp,(fy_atom *)local_98);
  local_44 = fyp->indent;
  local_c8.input_pos = 0;
  local_c8.line = 0;
  local_c8.column = 0;
  uVar19 = 0xffffffff;
  local_a0 = (void *)0x0;
  local_b0 = 0;
  lVar14 = 0;
  local_60 = (fy_token *)0x0;
  local_a8 = 0;
  uVar12 = 0;
  iVar18 = 0;
  local_50 = 0;
  do {
    uVar5 = (uint)uVar19;
    local_40 = uVar12;
    if (fyp->column == 0) {
      pcVar16 = (char *)fyp->current_ptr;
      if ((pcVar16 == (char *)0x0) || (fyp->current_left < 3)) {
        apcStack_128[1] = (char *)0x134080;
        pcVar16 = (char *)fy_ensure_lookahead_slow_path(fyp,3,(size_t *)0x0);
        if (pcVar16 != (char *)0x0) goto LAB_00134085;
LAB_00134096:
        pcVar16 = (char *)fyp->current_ptr;
        if ((pcVar16 == (char *)0x0) || (fyp->current_left < 3)) {
          apcStack_128[1] = (char *)0x1340b5;
          pcVar16 = (char *)fy_ensure_lookahead_slow_path(fyp,3,(size_t *)0x0);
          if (pcVar16 == (char *)0x0) goto LAB_00133cb9;
        }
        if (((*pcVar16 != '.') || (pcVar16[1] != '.')) || (pcVar16[2] != '.')) goto LAB_00133cb9;
      }
      else {
LAB_00134085:
        if (((*pcVar16 != '-') || (pcVar16[1] != '-')) || (pcVar16[2] != '-')) goto LAB_00134096;
      }
      apcStack_128[1] = (char *)0x1340e8;
      uVar6 = fy_parse_peek_at_offset(fyp,3);
      uVar12 = local_40;
      if (((uVar6 < 0x21) && ((0x100002600U >> ((ulong)uVar6 & 0x3f) & 1) != 0)) ||
         ((((fyp->current_input == (fy_input *)0x0 || ((fyp->current_input->field_0x74 & 1) == 0))
           && ((uVar6 - 0x2028 < 2 || (uVar6 == 0x85)))) || ((int)uVar6 < 1)))) goto LAB_00134192;
    }
LAB_00133cb9:
    apcStack_128[1] = (char *)0x133cc3;
    uVar5 = fy_parse_peek_at_offset(fyp,0);
    if (uVar5 == 0x23) break;
    local_54 = 0;
    uVar19 = (ulong)uVar5;
    while( true ) {
      uVar5 = (uint)uVar19;
      if (((uVar5 < 0x21) && ((0x100002600U >> (uVar19 & 0x3f) & 1) != 0)) ||
         ((((fyp->current_input == (fy_input *)0x0 || ((fyp->current_input->field_0x74 & 1) == 0))
           && ((uVar5 - 0x2028 < 2 || (uVar5 == 0x85)))) || ((int)uVar5 < 1)))) break;
      apcStack_128[1] = (char *)0x133d32;
      uVar6 = fy_parse_peek_at_offset(fyp,0);
      uVar12 = CONCAT44(extraout_var,uVar6);
      if (-1 < (int)uVar6) {
        sVar17 = 1;
        if ((0x7f < uVar6) && (sVar17 = 2, 0x7ff < uVar6)) {
          sVar17 = 4 - (ulong)(uVar6 < 0x10000);
        }
        apcStack_128[1] = (char *)0x133d64;
        iVar7 = fy_parse_peek_at_offset(fyp,sVar17);
        uVar12 = CONCAT44(extraout_var_00,iVar7);
      }
      skm._16_8_ = uVar12;
      if (uVar5 == 0x3a) {
        uVar6 = (uint)uVar12;
        if (((uVar6 < 0x21) && ((0x100002600U >> (uVar12 & 0x3f) & 1) != 0)) ||
           ((((fyp->current_input == (fy_input *)0x0 || ((fyp->current_input->field_0x74 & 1) == 0))
             && ((uVar6 - 0x2028 < 2 || (uVar6 == 0x85)))) || ((int)uVar6 < 1)))) break;
        if (fyp->flow_level != 0) {
          if (uVar6 < 0x80) {
            apcStack_128[1] = (char *)0x133ddf;
            pvVar10 = memchr(",[]{}",uVar6,6);
          }
          else {
            apcStack_128[1] = (char *)0x133df4;
            pvVar10 = fy_utf8_memchr_generic(",[]{}",uVar6,5);
          }
          if (pvVar10 == (void *)0x0) goto LAB_00133dfd;
          break;
        }
      }
      else {
LAB_00133dfd:
        if ((fyp->flow_level != 0) &&
           (((uVar5 - 0x5b < 0x23 && ((0x500000005U >> ((ulong)(uVar5 - 0x5b) & 0x3f) & 1) != 0)) ||
            (uVar5 == 0x2c)))) break;
      }
      if (iVar18 == 0) {
        if (iVar4 != 0) goto LAB_00133e4c;
      }
      else {
        iVar4 = iVar18 + -1;
        if (iVar18 < 2) {
          iVar4 = 1;
        }
LAB_00133e4c:
        local_50 = local_50 + (long)iVar4;
      }
      local_31 = uVar5 - 0x110001 < 0xffef001f;
      apcStack_128[1] = (char *)0x133e7b;
      fy_advance(fyp,uVar5);
      lVar11 = 1;
      if ((0x7f < uVar5) && (lVar11 = 2, 0x7ff < uVar5)) {
        lVar11 = 4 - (ulong)(uVar5 < 0x10000);
      }
      local_50 = local_50 + lVar11;
      local_40 = CONCAT71((int7)(local_40 >> 8),
                          (byte)local_40 | (uVar5 == 0x22 || uVar5 == 0x5c) | local_31);
      local_54 = local_54 + -1;
      iVar4 = 0;
      iVar18 = 0;
      uVar19 = skm._16_8_;
    }
    if (local_54 != 0) {
      local_c8.input_pos = fyp->current_input_pos;
      local_a0 = fyp->current_ptr;
      local_c8.line = fyp->line;
      local_c8.column = fyp->column;
    }
    if ((((uVar5 != 9) && (uVar5 != 0x20)) && ((uVar5 != 10 && (uVar5 != 0xd)))) &&
       (((uVar12 = local_40, fyp->current_input != (fy_input *)0x0 &&
         ((fyp->current_input->field_0x74 & 1) != 0)) || ((1 < uVar5 - 0x2028 && (uVar5 != 0x85)))))
       ) goto LAB_00134192;
    iVar4 = 0;
    iVar18 = 0;
    do {
      iVar7 = (int)uVar19;
      apcStack_128[1] = (char *)0x133f4e;
      fy_advance(fyp,iVar7);
      if ((iVar7 == 9) && (fyp->tabsize == 0)) {
        if ((lVar14 != 0) && (fyp->column <= local_44)) {
          fydrc = &local_110;
          local_110.has_override = false;
          local_110._17_7_ = 0;
          local_110.override_file = (char *)0x0;
          local_110.override_line = 0;
          local_110.override_column = 0;
          local_110.type = FYET_ERROR;
          local_110.module = FYEM_SCAN;
          pfVar9 = fy_fill_atom_at(fyp,0,1,(fy_atom *)local_158);
          local_110.fyt = fy_token_create(FYTT_INPUT_MARKER,pfVar9);
          pcVar16 = "invalid tab used as indentation";
          goto LAB_00133969;
        }
        apcStack_128[1] = (char *)0x133f76;
        iVar8 = fy_parse_peek_at_offset(fyp,0);
        uVar12 = CONCAT44(extraout_var_01,iVar8);
LAB_00133f8e:
        pfVar13 = fyp->current_input;
        if (((pfVar13 == (fy_input *)0x0) || ((pfVar13->field_0x74 & 1) == 0)) &&
           ((pfVar13 = (fy_input *)(ulong)(iVar7 - 0x2028U), iVar7 - 0x2028U < 2 || (iVar7 == 0x85))
           )) goto LAB_00133fb2;
        iVar4 = iVar4 + 1;
        lVar11 = CONCAT71((int7)((ulong)pfVar13 >> 8),1);
        local_a8 = lVar11;
      }
      else {
        apcStack_128[1] = (char *)0x133f82;
        iVar8 = fy_parse_peek_at_offset(fyp,0);
        uVar12 = CONCAT44(extraout_var_02,iVar8);
        if ((iVar7 != 10) && (iVar7 != 0xd)) goto LAB_00133f8e;
LAB_00133fb2:
        if (lVar14 == 0) {
          lVar14 = 1;
        }
        iVar18 = iVar18 + 1;
        iVar4 = 0;
        local_b0 = 1;
        local_60 = (fy_token *)CONCAT71((int7)(uVar12 >> 8),1);
        lVar11 = lVar14;
      }
      uVar19 = uVar12 & 0xffffffff;
      uVar5 = (uint)uVar12;
    } while (((((uVar5 == 9) || (uVar5 == 0x20)) || (uVar5 == 10)) || (uVar5 == 0xd)) ||
            (((fyp->current_input == (fy_input *)0x0 || ((fyp->current_input->field_0x74 & 1) == 0))
             && ((uVar5 - 0x2028 < 2 || (uVar5 == 0x85))))));
    uVar15 = (undefined7)((ulong)lVar11 >> 8);
    uVar12 = CONCAT71(uVar15,1);
    if ((fyp->flow_level == 0) && (uVar12 = CONCAT71(uVar15,1), fyp->column <= local_44))
    goto LAB_00134192;
  } while( true );
  uVar5 = 0x23;
  uVar12 = local_40;
LAB_00134192:
  if (local_a0 == (void *)0x0) {
    apcStack_128[1] = (char *)0x1341c6;
    fy_fill_atom_end(fyp,(fy_atom *)local_98);
  }
  else {
    apcStack_128[1] = (char *)0x1341b5;
    fy_fill_atom_end_at(fyp,(fy_atom *)local_98,&local_c8);
  }
  sVar17 = local_50;
  if (uVar5 + 3 < 2) {
    fydrc = &local_110;
    local_110.has_override = false;
    local_110._17_7_ = 0;
    local_110.override_file = (char *)0x0;
    local_110.override_line = 0;
    local_110.override_column = 0;
    local_110.type = FYET_ERROR;
    local_110.module = FYEM_SCAN;
    pfVar9 = fy_fill_atom_mark(fyp->current_input,(fy_mark *)local_98,(fy_mark *)local_88,
                               (fy_atom *)local_158);
    local_110.fyt = fy_token_create(FYTT_INPUT_MARKER,pfVar9);
    pcVar16 = "plain scalar is malformed UTF8";
    goto LAB_00133969;
  }
  uVar1 = local_98._8_4_;
  uVar2 = local_88._8_4_;
  uVar5 = 0;
  if ((int)local_88._8_4_ <= (int)local_98._8_4_ && (uVar12 & 1) == 0) {
    uVar5 = (uint)(local_88._0_8_ - local_98._0_8_ == local_50) << 10;
  }
  local_44 = fyp->pending_complex_key_column;
  local_64 = (fyp->tabsize & 0xfU) << 0x16 |
             (uint)(local_50 == 0) << 0x14 |
             (uint)((byte)local_a8 & 1) << 0xe |
             (uint)((byte)local_60 & 1) << 0xd | local_64 & 0xfc000800 | uVar5;
  apcStack_128[1] = (char *)0x1342bc;
  iVar4 = fy_atom_format_text_length((fy_atom *)local_98);
  if (sVar17 != (long)iVar4) {
    apcStack_128[1] = (char *)0x134365;
    local_50 = sVar17;
    pcVar16 = fy_atom_data((fy_atom *)local_98);
    apcStack_128[1] = (char *)0x13437f;
    iVar18 = fy_utf8_format_text_length(pcVar16,local_88._0_8_ - local_98._0_8_,fyue_singlequote);
    lVar14 = -((long)iVar18 + 0x10U & 0xfffffffffffffff0);
    *(undefined8 *)((long)apcStack_128 + lVar14 + 8) = 0x1343a4;
    pcVar16 = fy_utf8_format_text(pcVar16,local_88._0_8_ - local_98._0_8_,acStack_118 + lVar14,
                                  (long)iVar18,fyue_singlequote);
    *(char **)(local_158 + lVar14 + 0x30) = pcVar16;
    *(size_t *)(local_158 + lVar14 + 0x28) = local_50;
    *(long *)(local_158 + lVar14 + 0x20) = (long)iVar4;
    *(undefined8 *)(local_158 + lVar14 + 0x18) = 0x1343db;
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,0xd68,"fy_fetch_plain_scalar",
                   "storage hint calculation failed real %zu != hint %zu - \'%s\'");
    return -1;
  }
  local_78 = sVar17;
  local_64 = local_64 | 0x800;
  pfVar13 = fyp->current_input;
  if ((pfVar13 != (fy_input *)0x0) && ((pfVar13->field_0x74 & 1) != 0)) {
    if ((int)uVar2 <= (int)uVar1) {
      apcStack_128[1] = (char *)0x1343f7;
      iVar4 = fy_atom_strcmp((fy_atom *)local_98,"false");
      if (iVar4 != 0) {
        apcStack_128[1] = (char *)0x13440e;
        iVar4 = fy_atom_strcmp((fy_atom *)local_98,"true");
        if (iVar4 != 0) {
          apcStack_128[1] = (char *)0x134425;
          iVar4 = fy_atom_strcmp((fy_atom *)local_98,"null");
          if (iVar4 != 0) {
            apcStack_128[1] = (char *)0x134435;
            _Var3 = fy_atom_is_number((fy_atom *)local_98);
            if (!_Var3) {
              local_110.has_override = false;
              local_110._17_7_ = 0;
              local_110.override_file = (char *)0x0;
              local_110.override_line = 0;
              local_110.override_column = 0;
              local_110.type = FYET_ERROR;
              local_110.module = FYEM_SCAN;
              pfVar9 = fy_fill_atom_mark(fyp->current_input,(fy_mark *)local_98,(fy_mark *)local_88,
                                         (fy_atom *)local_158);
              local_110.fyt = fy_token_create(FYTT_INPUT_MARKER,pfVar9);
              pcVar16 = "Invalid JSON plain scalar";
              goto LAB_001346c5;
            }
          }
        }
      }
      goto LAB_0013443d;
    }
    local_110.has_override = false;
    local_110._17_7_ = 0;
    local_110.override_file = (char *)0x0;
    local_110.override_line = 0;
    local_110.override_column = 0;
    local_110.type = FYET_ERROR;
    local_110.module = FYEM_SCAN;
    pfVar9 = fy_fill_atom_mark(pfVar13,(fy_mark *)local_98,(fy_mark *)local_88,(fy_atom *)local_158)
    ;
    local_110.fyt = fy_token_create(FYTT_INPUT_MARKER,pfVar9);
    pcVar16 = "Multi line plain scalars not supported in JSON mode";
LAB_001346c5:
    fydrc = &local_110;
LAB_00133969:
    fy_parser_diag_report(fyp,fydrc,pcVar16);
    return -1;
  }
LAB_0013443d:
  apcStack_128[1] = (char *)0x134455;
  local_60 = fy_token_queue(fyp,FYTT_SCALAR,local_98,0);
  if (local_60 == (fy_token *)0x0) {
    pcVar16 = "fy_token_queue() failed";
    iVar4 = 0xd7f;
    goto LAB_00134660;
  }
  if ((((int)uVar1 < (int)uVar2) && (fyp->flow_level == 0)) && (local_44 < 0)) {
    apcStack_128[1] = (char *)0x134489;
    iVar4 = fy_parse_peek_at(fyp,0);
    bVar20 = iVar4 == 0x3a;
    if (-1 < iVar4 && !bVar20) {
      iVar18 = 1;
      do {
        apcStack_128[1] = (char *)0x13453d;
        _Var3 = fyp_is_lb(fyp,iVar4);
        if ((_Var3) || ((iVar4 != 0x20 && (iVar4 != 9)))) goto LAB_00134578;
        apcStack_128[1] = (char *)0x134558;
        iVar4 = fy_parse_peek_at(fyp,iVar18);
        bVar20 = iVar4 == 0x3a;
      } while ((-1 < iVar4) && (iVar18 = iVar18 + 1, iVar4 != 0x3a));
    }
    if (bVar20) {
      local_110.has_override = false;
      local_110._17_7_ = 0;
      local_110.override_file = (char *)0x0;
      local_110.override_line = 0;
      local_110.override_column = 0;
      local_110.type = FYET_ERROR;
      local_110.module = FYEM_SCAN;
      pfVar9 = fy_fill_atom_mark(fyp->current_input,(fy_mark *)local_98,(fy_mark *)local_88,
                                 (fy_atom *)local_158);
      local_110.fyt = fy_token_create(FYTT_INPUT_MARKER,pfVar9);
      pcVar16 = "invalid multiline plain key";
      goto LAB_001346c5;
    }
  }
LAB_00134578:
  apcStack_128[1] = (char *)0x13458f;
  iVar4 = fy_save_simple_key_mark
                    (fyp,(fy_simple_key_mark *)local_e8,FYTT_SCALAR,(fy_mark *)local_88);
  if (iVar4 != 0) {
    apcStack_128[1] = (char *)0x1345bf;
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,0xd96,"fy_fetch_plain_scalar","fy_save_simple_key_mark() failed");
    return iVar4;
  }
  *(ushort *)&fyp->field_0x70 =
       (ushort)*(undefined4 *)&fyp->field_0x70 & 0xfff7 | (ushort)(byte)(((byte)local_b0 & 1) << 3);
  apcStack_128[0] = "true";
  if ((local_b0 & 1) == 0) {
    apcStack_128[0] = "false";
  }
  local_158._40_8_ = (fy_input *)0x134626;
  fy_parser_diag(fyp,0x20,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                 ,0xd99,"fy_fetch_plain_scalar","simple_key_allowed -> %s\n");
  apcStack_128[1] = (char *)0x134636;
  iVar4 = fy_attach_comments_if_any(fyp,local_60);
  if (iVar4 == 0) {
    return 0;
  }
  pcVar16 = "fy_attach_right_hand_comment() failed";
  iVar4 = 0xd9d;
LAB_00134660:
  apcStack_128[1] = (char *)0x134667;
  fy_parser_diag(fyp,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                 ,iVar4,"fy_fetch_plain_scalar",pcVar16);
  return -1;
}

Assistant:

int fy_fetch_plain_scalar(struct fy_parser *fyp, int c) {
    struct fy_atom handle;
    size_t length;
    int rc = -1, indent, run, nextc, i, breaks_found, blanks_found;
    bool has_leading_blanks, had_breaks;
    const char *last_ptr;
    struct fy_mark mark, last_mark;
    bool target_simple_key_allowed, is_multiline, is_complex, has_lb, has_ws;
    bool is_json_unesc, has_json_esc;
    struct fy_simple_key_mark skm;
    struct fy_token *fyt;
#ifdef ATOM_SIZE_CHECK
    size_t tlength;
#endif

    /* may not start with blankz */
    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !(fyp->state == FYPS_BLOCK_MAPPING_VALUE && fy_is_tab(c)), err_out,
                          "invalid tab as indendation in a mapping");

    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fyp_is_blankz(fyp, c), err_out,
                          "plain scalar cannot start with blank or zero");

    /* may not start with any of ,[]{}#&*!|>'\"%@` */
    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fy_utf8_strchr(",[]{}#&*!|>'\"%@`", c), err_out,
                          "plain scalar cannot start with '%c'", c);

    /* may not start with - not followed by blankz */
    FYP_PARSE_ERROR_CHECK(fyp, 0, 2, FYEM_SCAN,
                          c != '-' || !fy_is_blank_at_offset(fyp, 1), err_out,
                          "plain scalar cannot start with '%c' followed by blank", c);

    /* may not start with -?: not followed by blankz (in block context) */
    FYP_PARSE_ERROR_CHECK(fyp, 0, 2, FYEM_SCAN,
                          fyp->flow_level ||
                          !((c == '?' || c == ':') &&
                            fy_is_blank_at_offset(fyp, 1)), err_out,
                          "plain scalar cannot start with '%c' followed by blank (in block context)", c);

    /* check indentation */
    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fyp->flow_level || fyp->column > fyp->indent, err_out,
                          "wrongly indented flow %s",
                          fyp->flow == FYFT_SEQUENCE ? "sequence" : "mapping");

    fy_get_mark(fyp, &mark);
    target_simple_key_allowed = false;
    fy_get_simple_key_mark(fyp, &skm);

    fy_fill_atom_start(fyp, &handle);

    has_leading_blanks = false;
    had_breaks = false;
    has_lb = false;
    has_ws = false;
    has_json_esc = false;

    length = 0;
    breaks_found = 0;
    blanks_found = 0;
    indent = fyp->indent + 1;
    last_ptr = NULL;
    memset(&last_mark, 0, sizeof(last_mark));
    c = FYUG_EOF;
    for (;;) {
        /* break for document indicators */
        if (fyp->column == 0 &&
            (!fy_parse_strncmp(fyp, "---", 3) ||
             !fy_parse_strncmp(fyp, "...", 3)) &&
            fy_is_blankz_at_offset(fyp, 3))
            break;

        c = fy_parse_peek(fyp);
        if (c == '#')
            break;

        run = 0;
        for (;;) {
            if (fyp_is_blankz(fyp, c))
                break;

            nextc = fy_parse_peek_at(fyp, 1);

            /* ':' followed by space terminates */
            if (c == ':' && fyp_is_blankz(fyp, nextc))
                break;

            /* in flow context ':' followed by flow markers */
            if (fyp->flow_level && c == ':' && fy_utf8_strchr(",[]{}", nextc))
                break;

            /* in flow context any or , [ ] { } */
            if (fyp->flow_level && (c == ',' || c == '[' || c == ']' || c == '{' || c == '}'))
                break;

            if (breaks_found) {
                /* minimum 1 sep, or more for consecutive */
                length += breaks_found > 1 ? (breaks_found - 1) : 1;
                breaks_found = 0;
                blanks_found = 0;
            } else if (blanks_found) {
                /* just the blanks mam' */
                length += blanks_found;
                blanks_found = 0;
            }

            /* check whether we have a JSON unescaped character */
            is_json_unesc = fy_is_json_unescaped(c);
            if (!is_json_unesc)
                has_json_esc = true;

            fy_advance(fyp, c);
            run++;

            length += fy_utf8_width(c);

            c = nextc;
        }

        /* save end mark if we processed more than one non-blank */
        if (run > 0) {
            /* fyp_scan_debug(fyp, "saving mark"); */
            last_ptr = fyp->current_ptr;
            fy_get_mark(fyp, &last_mark);
        }

        /* end? */
        if (!(fy_is_blank(c) || fyp_is_lb(fyp, c)))
            break;

        has_json_esc = true;

        /* consume blanks */
        breaks_found = 0;
        blanks_found = 0;
        do {
            fy_advance(fyp, c);

            if (!fyp->tabsize) {
                /* check for tab */
                FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                                      c != '\t' || !has_leading_blanks || fyp->column >= indent, err_out,
                                      "invalid tab used as indentation");
            }

            nextc = fy_parse_peek(fyp);

            /* if it's a break */
            if (fyp_is_lb(fyp, c)) {
                /* first break, turn on leading blanks */
                if (!has_leading_blanks)
                    has_leading_blanks = true;
                had_breaks = true;
                breaks_found++;
                blanks_found = 0;
                has_lb = true;
            } else {
                blanks_found++;
                has_ws = true;
            }

            c = nextc;

        } while (fy_is_blank(c) || fyp_is_lb(fyp, c));

        /* break out if indentation is less */
        if (!fyp->flow_level && fyp->column < indent)
            break;
    }

    /* end... */
    if (!last_ptr)
        fy_fill_atom_end(fyp, &handle);
    else
        fy_fill_atom_end_at(fyp, &handle, &last_mark);

    if (c == FYUG_INV || c == FYUG_PARTIAL) {
        FYP_MARK_ERROR(fyp, &handle.start_mark, &handle.end_mark, FYEM_SCAN,
                       "plain scalar is malformed UTF8");
        goto err_out;
    }

    is_multiline = handle.end_mark.line > handle.start_mark.line;
    is_complex = fyp->pending_complex_key_column >= 0;

    handle.style = FYAS_PLAIN;
    handle.chomp = FYAC_STRIP;
    handle.direct_output = !is_multiline && !has_json_esc && fy_atom_size(&handle) == length;
    handle.empty = false;
    handle.has_lb = has_lb;
    handle.has_ws = has_ws;
    handle.starts_with_ws = false;
    handle.starts_with_lb = false;
    handle.ends_with_ws = false;
    handle.ends_with_lb = false;
    handle.trailing_lb = false;
    handle.size0 = length == 0;
    handle.valid_anchor = false;
    handle.tabsize = fyp->tabsize;

#ifdef ATOM_SIZE_CHECK
    tlength = fy_atom_format_text_length(&handle);
    fyp_error_check(fyp,
                    tlength == length,
                    err_out, "storage hint calculation failed real %zu != hint %zu - '%s'",
                    tlength, length,
                    fy_utf8_format_text_a(fy_atom_data(&handle), fy_atom_size(&handle), fyue_singlequote));
#endif

    handle.storage_hint = length;
    handle.storage_hint_valid = true;

    /* extra check in json mode */
    if (fyp_json_mode(fyp)) {
        FYP_MARK_ERROR_CHECK(fyp, &handle.start_mark, &handle.end_mark, FYEM_SCAN,
                             !is_multiline, err_out,
                             "Multi line plain scalars not supported in JSON mode");

        FYP_MARK_ERROR_CHECK(fyp, &handle.start_mark, &handle.end_mark, FYEM_SCAN,
                             !fy_atom_strcmp(&handle, "false") ||
                             !fy_atom_strcmp(&handle, "true") ||
                             !fy_atom_strcmp(&handle, "null") ||
                             fy_atom_is_number(&handle), err_out,
                             "Invalid JSON plain scalar");
    }

    /* and we're done */
    fyt = fy_token_queue(fyp, FYTT_SCALAR, &handle, FYSS_PLAIN);
    fyp_error_check(fyp, fyt, err_out_rc,
                    "fy_token_queue() failed");

    if (is_multiline && !fyp->flow_level && !is_complex) {
        /* due to the weirdness with simple keys scan forward
		* until a linebreak, ';', or anything else */
        for (i = 0;; i++) {
            c = fy_parse_peek_at(fyp, i);
            if (c < 0 || c == ':' || fyp_is_lb(fyp, c) || !fy_is_ws(c))
                break;
        }

        /* if we're a key, that's invalid */
        if (c == ':') {
            FYP_MARK_ERROR(fyp, &handle.start_mark, &handle.end_mark, FYEM_SCAN,
                           "invalid multiline plain key");
            goto err_out;
        }
    }

    target_simple_key_allowed = had_breaks;

    rc = fy_save_simple_key_mark(fyp, &skm, FYTT_SCALAR, &handle.end_mark);
    fyp_error_check(fyp, !rc, err_out_rc,
                    "fy_save_simple_key_mark() failed");

    fyp->simple_key_allowed = target_simple_key_allowed;
    fyp_scan_debug(fyp, "simple_key_allowed -> %s\n", fyp->simple_key_allowed ? "true" : "false");

    rc = fy_attach_comments_if_any(fyp, fyt);
    fyp_error_check(fyp, !rc, err_out_rc,
                    "fy_attach_right_hand_comment() failed");

    return 0;

    err_out:
    rc = -1;
    err_out_rc:
    return rc;
}